

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

size_t Catch::listReporters(Config *param_1)

{
  pointer *_str;
  int iVar1;
  IRegistryHub *pIVar2;
  undefined4 extraout_var;
  _Rb_tree_node_base *p_Var3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  undefined1 local_e0 [8];
  Text wrapper;
  undefined1 local_78 [32];
  long local_58;
  undefined1 local_50;
  undefined1 *local_48;
  long local_40;
  long local_38;
  
  std::operator<<((ostream *)&std::cout,"Available reporters:\n");
  pIVar2 = getRegistryHub();
  iVar1 = (*pIVar2->_vptr_IRegistryHub[2])(pIVar2);
  local_38 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x18))
                       ((long *)CONCAT44(extraout_var,iVar1));
  p_Var6 = (_Rb_tree_node_base *)(local_38 + 8);
  p_Var7 = (_Base_ptr)0x0;
  p_Var5 = *(_Rb_tree_node_base **)(local_38 + 0x18);
  for (p_Var3 = p_Var5; p_Var3 != p_Var6;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    if (p_Var7 <= p_Var3[1]._M_parent) {
      p_Var7 = p_Var3[1]._M_parent;
    }
  }
  local_48 = &p_Var7->field_0x7;
  local_40 = 0x48 - (long)p_Var7;
  _str = &wrapper.lines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  for (; p_Var5 != p_Var6; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    (**(code **)(**(long **)(p_Var5 + 2) + 0x18))(_str);
    local_50 = 9;
    local_78._16_8_ = 0;
    local_78._24_8_ = local_48;
    local_58 = local_40;
    Tbc::Text::Text((Text *)local_e0,(string *)_str,
                    (TextAttributes *)
                    &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78)
                     ->field_2);
    std::__cxx11::string::~string((string *)_str);
    poVar4 = std::operator<<((ostream *)&std::cout,"  ");
    poVar4 = std::operator<<(poVar4,(string *)(p_Var5 + 1));
    poVar4 = std::operator<<(poVar4,":");
    wrapper.lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_78;
    std::__cxx11::string::_M_construct
              ((ulong)_str,((char)p_Var7 + '\x02') - (char)p_Var5[1]._M_parent);
    poVar4 = std::operator<<(poVar4,(string *)_str);
    poVar4 = Tbc::operator<<(poVar4,(Text *)local_e0);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)_str);
    Tbc::Text::~Text((Text *)local_e0);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return *(size_t *)(local_38 + 0x28);
}

Assistant:

inline std::size_t listReporters( Config const& /*config*/ ) {
        Catch::cout() << "Available reporters:\n";
        IReporterRegistry::FactoryMap const& factories = getRegistryHub().getReporterRegistry().getFactories();
        IReporterRegistry::FactoryMap::const_iterator itBegin = factories.begin(), itEnd = factories.end(), it;
        std::size_t maxNameLen = 0;
        for(it = itBegin; it != itEnd; ++it )
            maxNameLen = (std::max)( maxNameLen, it->first.size() );

        for(it = itBegin; it != itEnd; ++it ) {
            Text wrapper( it->second->getDescription(), TextAttributes()
                                                        .setInitialIndent( 0 )
                                                        .setIndent( 7+maxNameLen )
                                                        .setWidth( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen-8 ) );
            Catch::cout() << "  "
                    << it->first
                    << ":"
                    << std::string( maxNameLen - it->first.size() + 2, ' ' )
                    << wrapper << "\n";
        }
        Catch::cout() << std::endl;
        return factories.size();
    }